

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O0

void __thiscall lsim::SimCircuit::build_name(SimCircuit *this,uint32_t comp_id)

{
  string *psVar1;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  uint32_t local_14;
  SimCircuit *pSStack_10;
  uint32_t comp_id_local;
  SimCircuit *this_local;
  
  local_14 = comp_id;
  pSStack_10 = this;
  psVar1 = ModelCircuit::name_abi_cxx11_(this->m_circuit_desc);
  std::__cxx11::string::operator=((string *)&this->m_name,(string *)psVar1);
  std::__cxx11::to_string(&local_58,local_14);
  std::operator+(&local_38,"#",&local_58);
  std::__cxx11::string::operator+=((string *)&this->m_name,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void SimCircuit::build_name(uint32_t comp_id) {
    m_name = m_circuit_desc->name();
    m_name += "#" + std::to_string(comp_id);
}